

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  uint uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  undefined4 uVar3;
  uint iDb;
  int iVar4;
  uint uVar5;
  int iVar6;
  Token *zName;
  Table *pTVar7;
  Vdbe *p;
  Index *pIVar8;
  char *zArg1;
  char *pcVar9;
  int iVar10;
  Parse *pPVar11;
  bool bVar12;
  Token *pName;
  Token *local_38;
  
  db = pParse->db;
  iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_38);
  if ((int)iDb < 0) {
    return;
  }
  if (((isTemp != 0) && (bVar12 = iDb != 1, iDb = 1, bVar12)) && (pName2->n != 0)) {
    sqlite3ErrorMsg(pParse,"temporary table name must be unqualified");
    return;
  }
  uVar1 = local_38->n;
  uVar3 = *(undefined4 *)&local_38->field_0xc;
  (pParse->sNameToken).z = local_38->z;
  (pParse->sNameToken).n = uVar1;
  *(undefined4 *)&(pParse->sNameToken).field_0xc = uVar3;
  zName = (Token *)sqlite3NameFromToken(db,local_38);
  if (zName == (Token *)0x0) {
    return;
  }
  iVar4 = sqlite3CheckObjectName(pParse,(char *)zName);
  if (iVar4 != 0) goto LAB_001420ff;
  if ((db->init).iDb == '\x01') {
    isTemp = 1;
  }
  pcVar9 = db->aDb[iDb].zName;
  zArg1 = "sqlite_master";
  if (isTemp == 1) {
    zArg1 = "sqlite_temp_master";
  }
  iVar4 = sqlite3AuthCheck(pParse,0x12,zArg1,(char *)0x0,pcVar9);
  if (iVar4 != 0) goto LAB_001420ff;
  if (isVirtual == 0) {
    bVar12 = isTemp != 0;
    iVar4 = (uint)(isTemp == 0) * 2 + 6;
    if (isView == 0) {
      iVar4 = bVar12 + 2 + (uint)bVar12;
    }
    iVar4 = sqlite3AuthCheck(pParse,iVar4,(char *)zName,(char *)0x0,pcVar9);
    if (iVar4 != 0) goto LAB_001420ff;
  }
  if (pParse->declareVtab == '\0') {
    pcVar9 = db->aDb[iDb].zName;
    iVar4 = sqlite3ReadSchema(pParse);
    if (iVar4 != 0) goto LAB_001420ff;
    pTVar7 = sqlite3FindTable(db,(char *)zName,pcVar9);
    if (pTVar7 == (Table *)0x0) {
      pIVar8 = sqlite3FindIndex(db,(char *)zName,pcVar9);
      if (pIVar8 == (Index *)0x0) goto LAB_00142131;
      pcVar9 = "there is already an index named %s";
      local_38 = zName;
    }
    else {
      if (noErr != 0) {
        sqlite3CodeVerifySchema(pParse,iDb);
        goto LAB_001420ff;
      }
      pcVar9 = "table %T already exists";
    }
    sqlite3ErrorMsg(pParse,pcVar9,local_38);
  }
  else {
LAB_00142131:
    pTVar7 = (Table *)sqlite3DbMallocRaw(db,0x80);
    if (pTVar7 != (Table *)0x0) {
      pTVar7->zName = (char *)0x0;
      pTVar7->aCol = (Column *)0x0;
      pTVar7->iPKey = 0;
      pTVar7->nCol = 0;
      pTVar7->nRef = 0;
      pTVar7->szTabRow = 0;
      pTVar7->tabFlags = '\0';
      pTVar7->keyConf = '\0';
      *(undefined2 *)&pTVar7->field_0x4a = 0;
      pTVar7->addColOffset = 0;
      pTVar7->pSchema = (Schema *)0x0;
      pTVar7->pNextZombie = (Table *)0x0;
      pTVar7->pVTable = (VTable *)0x0;
      pTVar7->pTrigger = (Trigger *)0x0;
      *(undefined8 *)&pTVar7->nModuleArg = 0;
      pTVar7->azModuleArg = (char **)0x0;
      pTVar7->pCheck = (ExprList *)0x0;
      pTVar7->nRowLogEst = 0;
      *(undefined2 *)&pTVar7->field_0x3a = 0;
      pTVar7->tnum = 0;
      pTVar7->pFKey = (FKey *)0x0;
      pTVar7->zColAff = (char *)0x0;
      pTVar7->pIndex = (Index *)0x0;
      pTVar7->pSelect = (Select *)0x0;
      pTVar7->zName = (char *)zName;
      pTVar7->iPKey = -1;
      pSVar2 = db->aDb[iDb].pSchema;
      pTVar7->pSchema = pSVar2;
      pTVar7->nRef = 1;
      pTVar7->nRowLogEst = 200;
      pParse->pNewTable = pTVar7;
      if ((pParse->nested == '\0') && (iVar4 = strcmp((char *)zName,"sqlite_sequence"), iVar4 == 0))
      {
        pSVar2->pSeqTab = pTVar7;
      }
      if (((db->init).busy == '\0') && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
        pPVar11 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar11 = pParse;
        }
        sqlite3CodeVerifySchema(pParse,iDb);
        pPVar11->writeMask = pPVar11->writeMask | 1 << ((byte)iDb & 0x1f);
        if (isVirtual != 0) {
          sqlite3VdbeAddOp3(p,0x92,0,0,0);
        }
        iVar10 = pParse->nMem;
        iVar4 = iVar10 + 1;
        pParse->regRowid = iVar4;
        iVar6 = iVar10 + 2;
        pParse->regRoot = iVar6;
        iVar10 = iVar10 + 3;
        pParse->nMem = iVar10;
        sqlite3VdbeAddOp3(p,0x33,iDb,iVar10,2);
        sqlite3VdbeUsesBtree(p,iDb);
        uVar5 = sqlite3VdbeAddOp3(p,0x2d,iVar10,0,0);
        sqlite3VdbeAddOp3(p,0x19,(uint)(-1 < (short)db->flags) * 3 + 1,iVar10,0);
        sqlite3VdbeAddOp3(p,0x34,iDb,2,iVar10);
        sqlite3VdbeAddOp3(p,0x19,(uint)db->enc,iVar10,0);
        sqlite3VdbeAddOp3(p,0x34,iDb,5,iVar10);
        uVar1 = p->nOp;
        if (uVar5 < uVar1) {
          p->aOp[uVar5].p2 = uVar1;
        }
        p->pParse->iFixedOp = uVar1 - 1;
        if (isVirtual == 0 && isView == 0) {
          iVar6 = sqlite3VdbeAddOp3(p,0x79,iDb,iVar6,0);
          pParse->addrCrTab = iVar6;
        }
        else {
          sqlite3VdbeAddOp3(p,0x19,0,iVar6,0);
        }
        sqlite3OpenMasterTable(pParse,iDb);
        sqlite3VdbeAddOp3(p,0x4a,0,iVar4,0);
        sqlite3VdbeAddOp3(p,0x1c,0,iVar10,0);
        sqlite3VdbeAddOp3(p,0x4b,0,iVar10,iVar4);
        if (p->aOp != (Op *)0x0) {
          p->aOp[(long)p->nOp + -1].p5 = '\b';
        }
        sqlite3VdbeAddOp3(p,0x3d,0,0,0);
        return;
      }
      return;
    }
    db->mallocFailed = '\x01';
    pParse->rc = 7;
    pParse->nErr = pParse->nErr + 1;
  }
LAB_001420ff:
  sqlite3DbFree(db,zName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  /* The table or view name to create is passed to this routine via tokens
  ** pName1 and pName2. If the table name was fully qualified, for example:
  **
  ** CREATE TABLE xxx.yyy (...);
  ** 
  ** Then pName1 is set to "xxx" and pName2 "yyy". On the other hand if
  ** the table name is not fully qualified, i.e.:
  **
  ** CREATE TABLE yyy(...);
  **
  ** Then pName1 is set to "yyy" and pName2 is "".
  **
  ** The call below sets the pName pointer to point at the token (pName1 or
  ** pName2) that stores the unqualified table name. The variable iDb is
  ** set to the index of the database that the table or view is to be
  ** created in.
  */
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  if( iDb<0 ) return;
  if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
    /* If creating a temp table, the name may not be qualified. Unless 
    ** the database name is "temp" anyway.  */
    sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
    return;
  }
  if( !OMIT_TEMPDB && isTemp ) iDb = 1;

  pParse->sNameToken = *pName;
  zName = sqlite3NameFromToken(db, pName);
  if( zName==0 ) return;
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( (isTemp & 1)==isTemp );
  {
    int code;
    char *zDb = db->aDb[iDb].zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( isView ){
      if( !OMIT_TEMPDB && isTemp ){
        code = SQLITE_CREATE_TEMP_VIEW;
      }else{
        code = SQLITE_CREATE_VIEW;
      }
    }else{
      if( !OMIT_TEMPDB && isTemp ){
        code = SQLITE_CREATE_TEMP_TABLE;
      }else{
        code = SQLITE_CREATE_TABLE;
      }
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, code, zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_DECLARE_VTAB ){
    char *zDb = db->aDb[iDb].zName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "table %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    db->mallocFailed = 1;
    pParse->rc = SQLITE_NOMEM;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nRef = 1;
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* If this is the magic sqlite_sequence table used by autoincrement,
  ** then record a pointer to this table in the main database structure
  ** so that INSERT can find the table easily.
  */
#ifndef SQLITE_OMIT_AUTOINCREMENT
  if( !pParse->nested && strcmp(zName, "sqlite_sequence")==0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTable->pSchema->pSeqTab = pTable;
  }
#endif

  /* Begin generating the code that will insert the table record into
  ** the SQLITE_MASTER table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the 
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int j1;
    int fileFormat;
    int reg1, reg2, reg3;
    sqlite3BeginWriteOperation(pParse, 0, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set, 
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    j1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp2(v, OP_Integer, fileFormat, reg3);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, reg3);
    sqlite3VdbeAddOp2(v, OP_Integer, ENC(db), reg3);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, reg3);
    sqlite3VdbeJumpHere(v, j1);

    /* This just creates a place-holder record in the sqlite_master table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      pParse->addrCrTab = sqlite3VdbeAddOp2(v, OP_CreateTable, iDb, reg2);
    }
    sqlite3OpenMasterTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp2(v, OP_Null, 0, reg3);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  sqlite3DbFree(db, zName);
  return;
}